

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

Vec_Int_t * Gia_ManSimSimulateOne(Gia_Man_t *p,Vec_Int_t *vPat)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint local_44;
  
  if (vPat->nSize % (p->vCis->nSize - p->nRegs) != 0) {
    __assert_fail("Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x2c5,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
  iVar14 = p->nRegs;
  if (0 < iVar14) {
    iVar6 = 0;
    do {
      iVar7 = p->vCis->nSize;
      uVar12 = (iVar7 - iVar14) + iVar6;
      if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) {
LAB_00225943:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCis->pArray[uVar12];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00225924:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar7;
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xbfffffffffffffff;
      iVar6 = iVar6 + 1;
      iVar14 = p->nRegs;
    } while (iVar6 < iVar14);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  uVar12 = vPat->nSize;
  pVVar9 = p->vCis;
  uVar2 = pVVar9->nSize;
  if ((int)uVar12 / (int)(uVar2 - iVar14) < 1) {
    local_44 = 0;
  }
  else {
    iVar6 = 0;
    local_44 = 0;
    do {
      uVar13 = (ulong)uVar2;
      if (iVar14 < (int)uVar2) {
        lVar10 = 0;
        do {
          if ((int)uVar13 <= lVar10) goto LAB_00225943;
          iVar14 = pVVar9->pArray[lVar10];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00225924;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (((int)local_44 < 0) || (vPat->nSize <= (int)(local_44 + (int)lVar10)))
          goto LAB_00225943;
          pGVar5 = p->pObjs + iVar14;
          *(ulong *)pGVar5 =
               *(ulong *)pGVar5 & 0xbfffffffffffffff |
               (ulong)(vPat->pArray[(ulong)local_44 + lVar10] & 1) << 0x3e;
          lVar10 = lVar10 + 1;
          pVVar9 = p->vCis;
          uVar13 = (ulong)pVVar9->nSize;
        } while (lVar10 < (long)(uVar13 - (long)p->nRegs));
        local_44 = local_44 + (int)lVar10;
      }
      iVar14 = p->nObjs;
      if (0 < iVar14) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar13 = *(ulong *)(&pGVar5->field_0x0 + lVar10);
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            *(ulong *)(&pGVar5->field_0x0 + lVar10) =
                 uVar13 & 0xbfffffff7fffffff |
                 ((ulong)(((uint)(uVar13 >> 0x3d) ^
                          (uint)((ulong)*(undefined8 *)
                                         ((long)pGVar5 +
                                         (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3 + lVar10)
                                >> 0x3e)) &
                         ((uint)((ulong)*(undefined8 *)
                                         ((long)pGVar5 +
                                         (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3 +
                                         lVar10) >> 0x3e) ^ (uint)(uVar13 >> 0x1d) & 7)) & 1) <<
                 0x3e;
            iVar14 = p->nObjs;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar11 < iVar14);
      }
      pVVar9 = p->vCos;
      uVar13 = (ulong)(uint)pVVar9->nSize;
      if (0 < pVVar9->nSize) {
        lVar10 = 0;
        do {
          iVar14 = pVVar9->pArray[lVar10];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00225924;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar14;
          uVar13 = *(ulong *)pGVar5;
          *(ulong *)pGVar5 =
               uVar13 & 0xbfffffffffffffff |
               (uVar13 << 0x21 ^ *(ulong *)(pGVar5 + -(ulong)((uint)uVar13 & 0x1fffffff))) &
               0x4000000000000000;
          lVar10 = lVar10 + 1;
          pVVar9 = p->vCos;
          uVar13 = (ulong)pVVar9->nSize;
        } while (lVar10 < (long)uVar13);
      }
      iVar14 = p->nRegs;
      if (iVar14 < (int)uVar13) {
        lVar10 = 0;
        do {
          if ((int)uVar13 <= lVar10) goto LAB_00225943;
          iVar7 = pVVar9->pArray[lVar10];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00225924;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Vec_IntPush(p_00,(uint)((ulong)*(undefined8 *)(p->pObjs + iVar7) >> 0x3e) & 1);
          lVar10 = lVar10 + 1;
          iVar14 = p->nRegs;
          pVVar9 = p->vCos;
          uVar13 = (ulong)(uint)pVVar9->nSize;
        } while (lVar10 < pVVar9->nSize - iVar14);
      }
      if (0 < iVar14) {
        iVar7 = 0;
        do {
          iVar3 = p->vCos->nSize;
          uVar12 = (iVar3 - iVar14) + iVar7;
          if (((int)uVar12 < 0) || (iVar3 <= (int)uVar12)) goto LAB_00225943;
          iVar3 = p->vCos->pArray[uVar12];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00225924;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          iVar4 = p->vCis->nSize;
          uVar12 = (iVar4 - iVar14) + iVar7;
          if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) goto LAB_00225943;
          uVar12 = p->vCis->pArray[uVar12];
          lVar10 = (long)(int)uVar12;
          if ((lVar10 < 0) || ((uint)p->nObjs <= uVar12)) goto LAB_00225924;
          *(ulong *)(pGVar5 + lVar10) =
               *(ulong *)(pGVar5 + lVar10) & 0xbfffffffffffffff |
               *(ulong *)(pGVar5 + iVar3) & 0x4000000000000000;
          iVar7 = iVar7 + 1;
          iVar14 = p->nRegs;
        } while (iVar7 < iVar14);
      }
      iVar6 = iVar6 + 1;
      uVar12 = vPat->nSize;
      pVVar9 = p->vCis;
      uVar2 = pVVar9->nSize;
    } while (iVar6 < (int)uVar12 / (int)(uVar2 - iVar14));
  }
  if (local_44 != uVar12) {
    __assert_fail("k == Vec_IntSize(vPat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x2d7,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      puVar1 = (ulong *)(&p->pObjs->field_0x0 + lVar10);
      *puVar1 = *puVar1 & 0xbfffffffffffffff;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSimSimulateOne( Gia_Man_t * p, Vec_Int_t * vPat )
{
    Vec_Int_t * vPatOut;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k, f;
    assert( Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0 );
    Gia_ManConst0(p)->fMark1 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark1 = 0;
    vPatOut = Vec_IntAlloc( 1000 );
    for ( k = f = 0; f < Vec_IntSize(vPat) / Gia_ManPiNum(p); f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark1 = Vec_IntEntry( vPat, k++ );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vPatOut, pObj->fMark1 );
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->fMark1 = pObj->fMark1;
    }
    assert( k == Vec_IntSize(vPat) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark1 = 0;
    return vPatOut;
}